

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatrixSolver.cpp
# Opt level: O2

void __thiscall
TPZMatrixSolver<Fad<float>_>::TPZMatrixSolver
          (TPZMatrixSolver<Fad<float>_> *this,void **vtt,TPZMatrixSolver<Fad<float>_> *Source)

{
  (this->super_TPZSolver).super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[2];
  (this->super_TPZSolver).super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZSolver).super_TPZSavable._vptr_TPZSavable = (_func_int **)*vtt;
  TPZAutoPointer<TPZMatrix<Fad<float>_>_>::TPZAutoPointer(&this->fReferenceMatrix);
  TPZFMatrix<Fad<float>_>::TPZFMatrix(&this->fScratch);
  TPZAutoPointer<TPZMatrix<Fad<float>_>_>::TPZAutoPointer(&this->fContainer);
  TPZAutoPointer<TPZMatrix<Fad<float>_>_>::operator=
            (&this->fReferenceMatrix,&Source->fReferenceMatrix);
  TPZAutoPointer<TPZMatrix<Fad<float>_>_>::operator=(&this->fContainer,&Source->fContainer);
  return;
}

Assistant:

TPZMatrixSolver<TVar>::TPZMatrixSolver(const TPZMatrixSolver<TVar> &Source) :
fScratch()
{
	fReferenceMatrix = Source.fReferenceMatrix;
	fContainer = Source.fContainer;
}